

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

string * __thiscall
cmFilePathChecksum::get(string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath)

{
  bool bVar1;
  ulong uVar2;
  uchar *input;
  size_type len;
  cmBase32Encoder local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string_view local_148;
  cmCryptoHash local_138;
  undefined1 local_128 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashBytes;
  string local_f0;
  const_iterator local_d0;
  value_type *pDir;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
  *__range1;
  string parentDir;
  undefined1 local_80 [8];
  string fileReal;
  string relSeed;
  string relPath;
  string *filePath_local;
  cmFilePathChecksum *this_local;
  
  std::__cxx11::string::string((string *)(relSeed.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(fileReal.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetRealPath((string *)local_80,filePath,(string *)0x0);
  std::__cxx11::string::string((string *)&__range1);
  __begin1 = (const_iterator)this;
  __end1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::begin(&this->parentDirs);
  pDir = std::
         array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
         ::end((array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
                *)__begin1);
  do {
    if (__end1 == pDir) {
LAB_00832d6c:
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)(fileReal.field_2._M_local_buf + 8),"FileSystemRoot");
        cmsys::SystemTools::SplitPathRootComponent((string *)local_80,(string *)&__range1);
      }
      cmsys::SystemTools::GetParentDirectory
                ((string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_80);
      cmsys::SystemTools::RelativePath
                (&local_f0,(string *)&__range1,
                 (string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator=
                ((string *)(relSeed.field_2._M_local_buf + 8),(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string
                ((string *)
                 &hashBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_80);
      cmCryptoHash::cmCryptoHash(&local_138,AlgoSHA256);
      std::operator+(&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileReal.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&relSeed.field_2 + 8));
      local_148 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_168);
      cmCryptoHash::ByteHashString
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,&local_138,
                 local_148);
      std::__cxx11::string::~string((string *)&local_168);
      cmCryptoHash::~cmCryptoHash(&local_138);
      cmBase32Encoder::cmBase32Encoder(&local_169);
      input = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      cmBase32Encoder::encodeString_abi_cxx11_(__return_storage_ptr__,&local_169,input,len,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      std::__cxx11::string::~string((string *)(fileReal.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(relSeed.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    local_d0 = __end1;
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (bVar1 = cmsys::SystemTools::IsSubDirectory((string *)local_80,&local_d0->first), bVar1)) {
      std::__cxx11::string::operator=((string *)&__range1,(string *)local_d0);
      std::__cxx11::string::operator=
                ((string *)(fileReal.field_2._M_local_buf + 8),(string *)&local_d0->second);
      goto LAB_00832d6c;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

std::string cmFilePathChecksum::get(std::string const& filePath) const
{
  std::string relPath;
  std::string relSeed;
  {
    std::string const fileReal = cmSystemTools::GetRealPath(filePath);
    std::string parentDir;
    // Find closest project parent directory
    for (auto const& pDir : this->parentDirs) {
      if (!pDir.first.empty() &&
          cmsys::SystemTools::IsSubDirectory(fileReal, pDir.first)) {
        parentDir = pDir.first;
        relSeed = pDir.second;
        break;
      }
    }
    // Use file system root as fallback parent directory
    if (parentDir.empty()) {
      relSeed = "FileSystemRoot";
      cmsys::SystemTools::SplitPathRootComponent(fileReal, &parentDir);
    }
    // Calculate relative path from project parent directory
    relPath = cmsys::SystemTools::RelativePath(
      parentDir, cmsys::SystemTools::GetParentDirectory(fileReal));
  }

  // Calculate the file ( seed + relative path ) binary checksum
  std::vector<unsigned char> hashBytes =
    cmCryptoHash(cmCryptoHash::AlgoSHA256).ByteHashString(relSeed + relPath);

  // Convert binary checksum to string
  return cmBase32Encoder().encodeString(hashBytes.data(), hashBytes.size(),
                                        false);
}